

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-from-text.cpp
# Opt level: O1

void __thiscall yactfr::internal::JsonValBuilder::onObjEnd(JsonValBuilder *this,TextLocation *loc)

{
  _Rb_tree_header *p_Var1;
  pointer p_Var2;
  _Base_ptr p_Var3;
  _Rep_type *p_Var4;
  _tStackFrame *__p;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
  local_40;
  
  p_Var2 = (this->_stack).
           super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent =
       p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var4 = &local_40;
    local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var1 = &p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_color =
         p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    p_Var3 = p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right =
         p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &p_Var2[-1].objValCont._M_t;
    local_40._M_impl.super__Rb_tree_header._M_node_count =
         p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    p_Var2[-1].objValCont._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
    ;
    local_40._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
  }
  (p_Var4->_M_impl).super__Rb_tree_header._M_node_count = 0;
  __p = (this->_stack).
        super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
        ._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->_stack).
  super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = __p;
  __gnu_cxx::new_allocator<yactfr::internal::JsonValBuilder::_tStackFrame>::
  destroy<yactfr::internal::JsonValBuilder::_tStackFrame>
            ((new_allocator<yactfr::internal::JsonValBuilder::_tStackFrame> *)&this->_stack,__p);
  _handleVal<std::map<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>>
            (this,loc,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
                       *)&local_40);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void onObjEnd(const TextLocation& loc)
    {
        auto objValCont = std::move(this->_stackTop().objValCont);

        _stack.pop_back();
        this->_handleVal(loc, std::move(objValCont));
    }